

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O3

int ** Amap_LibLookupTableAlloc(Vec_Ptr_t *vVec,int fVerbose)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  int **ppiVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  iVar9 = vVec->nSize;
  lVar10 = (long)iVar9;
  iVar8 = iVar9;
  if (0 < lVar10) {
    lVar6 = 0;
    do {
      iVar8 = iVar8 + *(int *)((long)vVec->pArray[lVar6] + 4);
      lVar6 = lVar6 + 1;
    } while (lVar10 != lVar6);
  }
  ppiVar5 = (int **)malloc(((long)iVar8 + lVar10 * 8) * 4);
  *ppiVar5 = (int *)(ppiVar5 + lVar10 * 4);
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  else {
    uVar7 = 0;
    iVar9 = 0;
    do {
      pvVar3 = vVec->pArray[uVar7];
      ppiVar5[uVar7] = *ppiVar5 + iVar9;
      iVar1 = *(int *)((long)pvVar3 + 4);
      iVar4 = iVar1;
      if (fVerbose != 0) {
        printf("%d : ",uVar7 & 0xffffffff);
        iVar4 = *(int *)((long)pvVar3 + 4);
      }
      lVar10 = 0;
      if (0 < iVar4) {
        do {
          uVar2 = *(uint *)(*(long *)((long)pvVar3 + 8) + lVar10 * 4);
          ppiVar5[uVar7][lVar10] = uVar2;
          if (fVerbose != 0) {
            printf("%d(%d) ",(ulong)(uVar2 & 0xffff),(ulong)(uint)((int)uVar2 >> 0x10));
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)pvVar3 + 4));
      }
      if (fVerbose != 0) {
        putchar(10);
      }
      iVar9 = iVar9 + iVar1 + 1;
      ppiVar5[uVar7][lVar10] = 0;
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)vVec->nSize);
  }
  if (iVar9 != iVar8) {
    __assert_fail("nTotal == nEntries",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapUniq.c"
                  ,0x133,"int **Amap_LibLookupTableAlloc(Vec_Ptr_t *, int)");
  }
  return ppiVar5;
}

Assistant:

int ** Amap_LibLookupTableAlloc( Vec_Ptr_t * vVec, int fVerbose )
{
    Vec_Int_t * vOne;
    int ** pRes, * pBuffer;
    int i, k, nTotal, nSize, nEntries, Value;
    // count the total size
    nEntries = nSize = Vec_PtrSize( vVec );
    Vec_PtrForEachEntry( Vec_Int_t *, vVec, vOne, i )
        nEntries += Vec_IntSize(vOne);
    pBuffer = ABC_ALLOC( int, nSize * sizeof(void *) + nEntries );
    pRes = (int **)pBuffer;
    pRes[0] = pBuffer + nSize * sizeof(void *);
    nTotal = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vVec, vOne, i )
    {
        pRes[i] = pRes[0] + nTotal;
        nTotal += Vec_IntSize(vOne) + 1;
        if ( fVerbose )
        printf( "%d : ", i );
        Vec_IntForEachEntry( vOne, Value, k )
        {
            pRes[i][k] = Value;
            if ( fVerbose )
            printf( "%d(%d) ", Value&0xffff, Value>>16 );
        }
        if ( fVerbose )
        printf( "\n" );
        pRes[i][k] = 0;
    }
    assert( nTotal == nEntries );
    return pRes;
}